

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::chooseColumn(HEkkDual *this,HVector *row_ep)

{
  pointer piVar1;
  value_type vVar2;
  value_type vVar3;
  HighsInt HVar4;
  reference pvVar5;
  reference pvVar6;
  double *pdVar7;
  char *pcVar8;
  int __x;
  HEkkDualRow *in_RDI;
  double extraout_XMM0_Qa;
  HighsInt i;
  double scaled_value;
  double alpha_row;
  double growth_tolerance;
  bool chooseColumnFail;
  HighsInt chuzc_pass;
  double row_ep_scale;
  bool quad_precision;
  bool debug_rows_report;
  bool debug_small_pivot_issue_report;
  bool debug_small_pivot_issue_report_on;
  bool debug_price_report_on;
  HighsInt debug_price_report;
  HighsLp *lp;
  HighsOptions *options;
  HighsInt in_stack_fffffffffffffe98;
  HighsInt in_stack_fffffffffffffe9c;
  HighsSimplexAnalysis *in_stack_fffffffffffffea0;
  vector<double,_std::allocator<double>_> *this_00;
  HEkk *in_stack_fffffffffffffea8;
  allocator *paVar9;
  HighsInt slice;
  HEkkDualRow *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffec0;
  HVector *in_stack_fffffffffffffec8;
  HVector *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  string *in_stack_fffffffffffffee8;
  HEkk *in_stack_fffffffffffffef0;
  undefined1 in_stack_ffffffffffffff0f;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff10;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff18;
  HighsInt in_stack_ffffffffffffff24;
  string *in_stack_ffffffffffffff28;
  HSimplexNla *in_stack_ffffffffffffff30;
  allocator local_c1;
  string local_c0 [36];
  uint local_9c;
  double local_98;
  allocator local_89;
  string local_88 [32];
  HVector *in_stack_ffffffffffffff98;
  HEkkDual *in_stack_ffffffffffffffa0;
  undefined1 local_51 [40];
  undefined1 local_29;
  byte local_28;
  byte local_27;
  undefined1 local_26;
  undefined1 local_25;
  undefined4 local_24;
  HighsInt *local_20;
  HEkkDualRow *this_01;
  
  HVar4 = (HighsInt)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  if (*(int *)&(in_RDI->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish == 0) {
    this_01 = *(HEkkDualRow **)(in_RDI->workNumTotPermutation + 2);
    local_20 = in_RDI->workNumTotPermutation + 0x866;
    local_24 = 0xfffffffe;
    local_25 = 0;
    local_26 = 0;
    local_27 = 0;
    local_28 = 0;
    local_29 = 0;
    HEkk::tableauRowPrice
              (in_stack_fffffffffffffef0,SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0),
               (HVector *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8,(HighsInt)((ulong)in_RDI >> 0x20));
    if ((local_28 & 1) != 0) {
      HVar4 = (HighsInt)((ulong)(in_RDI->workNumTotPermutation + 0xace) >> 0x20);
      in_stack_fffffffffffffec8 = (HVector *)local_51;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_51 + 1),"Row a_p",(allocator *)in_stack_fffffffffffffec8);
      HSimplexNla::reportArray
                ((HSimplexNla *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                 in_stack_fffffffffffffee4,in_stack_fffffffffffffed8,SUB81((ulong)in_RDI >> 0x38,0))
      ;
      std::__cxx11::string::~string((string *)(local_51 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_51);
      in_stack_fffffffffffffeb0 = (HEkkDualRow *)(in_RDI->workNumTotPermutation + 0xace);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,"Row e_p",&local_89);
      HSimplexNla::reportArray
                ((HSimplexNla *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                 in_stack_fffffffffffffee4,in_stack_fffffffffffffed8,SUB81((ulong)in_RDI >> 0x38,0))
      ;
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
    }
    HighsSimplexAnalysis::simplexTimerStart
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
    HEkkDualRow::clear((HEkkDualRow *)
                       &in_RDI[4].packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    in_RDI[4].sorted_workData.
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)in_RDI[5].alt_workGroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    HEkkDualRow::createFreemove
              ((HEkkDualRow *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8);
    HighsSimplexAnalysis::simplexTimerStop
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
    HighsSimplexAnalysis::simplexTimerStart
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
    HEkkDualRow::chooseMakepack(in_RDI,in_stack_fffffffffffffec8,HVar4);
    HEkkDualRow::chooseMakepack(in_RDI,in_stack_fffffffffffffec8,HVar4);
    local_98 = HEkk::getValueScale(in_stack_fffffffffffffea8,
                                   (HighsInt)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                                   (vector<double,_std::allocator<double>_> *)
                                   CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    HighsSimplexAnalysis::simplexTimerStop
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
    local_9c = 0;
    while( true ) {
      HighsSimplexAnalysis::simplexTimerStart
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
      HEkkDualRow::choosePossible
                ((HEkkDualRow *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      HighsSimplexAnalysis::simplexTimerStop
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
      *(undefined4 *)
       ((long)&in_RDI[5].sorted_workData.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0xffffffff;
      if (((double)in_RDI[4].alt_workGroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish <= 0.0) ||
         (*(int *)((long)&in_RDI[4].alt_workGroup.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 4) == 0)) break;
      __x = (int)in_RDI + 0x5c0;
      HVar4 = HEkkDualRow::chooseFinal(this_01);
      slice = (HighsInt)((ulong)in_stack_fffffffffffffea8 >> 0x20);
      if (HVar4 != 0) {
        *(undefined4 *)
         &(in_RDI->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = 9;
        return;
      }
      if (*(int *)&in_RDI[4].alt_workGroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage < 0) {
        if ((0 < (int)local_9c) && ((local_27 & 1) != 0)) {
          printf("                                                       No pivot after %2d CHUZC passes\n"
                 ,(ulong)local_9c);
        }
LAB_00789899:
        HighsSimplexAnalysis::simplexTimerStart
                  (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
        HEkkDualRow::deleteFreemove(in_stack_fffffffffffffeb0);
        HighsSimplexAnalysis::simplexTimerStop
                  (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
        *(undefined4 *)
         ((long)&in_RDI[5].sorted_workData.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
             *(undefined4 *)
              &in_RDI[4].alt_workGroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        in_RDI[6].ekk_instance_ =
             (HEkk *)in_RDI[4].alt_workGroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
        in_RDI[5].alt_workGroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             in_RDI[4].alt_workGroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (*(int *)((long)&in_RDI->workDelta + 4) != 1) {
          return;
        }
        if ((in_RDI->workSize & 1) != 0) {
          return;
        }
        HighsSimplexAnalysis::simplexTimerStart
                  (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
        HEkkDualRow::computeDevexWeight(in_stack_fffffffffffffeb0,slice);
        in_RDI[6].workNumTotPermutation =
             &(in_RDI[4].sorted_workData.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->first;
        pdVar7 = std::max<double>((double *)&stack0xfffffffffffffed8,
                                  (double *)&in_RDI[6].workNumTotPermutation);
        in_RDI[6].workNumTotPermutation = (HighsInt *)*pdVar7;
        HighsSimplexAnalysis::simplexTimerStop
                  (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
        return;
      }
      piVar1 = this_01[1].alt_workGroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      std::abs(__x);
      if ((double)piVar1 < extraout_XMM0_Qa) {
        if ((0 < (int)local_9c) && ((local_27 & 1) != 0)) {
          printf("                                                       Variable %6d Pivot %11.4g (dual %11.4g; ratio = %11.4g) is OK after %2d CHUZC passes\n"
                 ,in_RDI[4].alt_workGroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                 *(undefined8 *)
                  ((in_RDI->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start +
                  (long)*(int *)&in_RDI[4].alt_workGroup.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage * 2),
                 *(double *)
                  ((in_RDI->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start +
                  (long)*(int *)&in_RDI[4].alt_workGroup.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage * 2) /
                 (double)in_RDI[4].alt_workGroup.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                 (ulong)*(uint *)&in_RDI[4].alt_workGroup.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,(ulong)local_9c);
        }
      }
      else {
        if ((local_9c == 0) && ((local_27 & 1) != 0)) {
          printf("CHUZC: Solve %6d; Iter %4d; ||e_p|| = %11.4g: Variable %6d Pivot %11.4g (dual %11.4g; ratio = %11.4g) is small"
                 ,1.0 / local_98,
                 in_RDI[4].alt_workGroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 *(undefined8 *)
                  ((in_RDI->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start +
                  (long)*(int *)&in_RDI[4].alt_workGroup.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage * 2),
                 *(double *)
                  ((in_RDI->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start +
                  (long)*(int *)&in_RDI[4].alt_workGroup.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage * 2) /
                 (double)in_RDI[4].alt_workGroup.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                 (ulong)(uint)in_RDI->workNumTotPermutation[0xe18],
                 (ulong)(uint)in_RDI->workNumTotPermutation[0xdbe],
                 (ulong)*(uint *)&in_RDI[4].alt_workGroup.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage);
        }
        if (local_9c == 0) {
          if ((local_27 & 1) != 0) {
            printf(": improve row\n");
          }
          in_RDI->workNumTotPermutation[0x224] = in_RDI->workNumTotPermutation[0x224] + 1;
          improveChooseColumnRow(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        }
        else {
          in_RDI->workNumTotPermutation[0x225] = in_RDI->workNumTotPermutation[0x225] + 1;
          for (in_stack_fffffffffffffee4 = 0;
              in_stack_fffffffffffffee4 <
              *(int *)&in_RDI[4].workGroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              in_stack_fffffffffffffee4 = in_stack_fffffffffffffee4 + 1) {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                &in_RDI[4].workGroup.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (long)in_stack_fffffffffffffee4);
            if (*pvVar5 ==
                *(int *)&in_RDI[4].alt_workGroup.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage) {
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)
                                  &in_RDI[4].workGroup.super__Vector_base<int,_std::allocator<int>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (long)(*(int *)&in_RDI[4].workGroup.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish + -1));
              vVar3 = *pvVar5;
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)
                                  &in_RDI[4].workGroup.super__Vector_base<int,_std::allocator<int>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (long)in_stack_fffffffffffffee4);
              *pvVar5 = vVar3;
              pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)
                                  &in_RDI[4].original_workData.
                                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,
                                  (long)(*(int *)&in_RDI[4].workGroup.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish + -1));
              vVar2 = *pvVar6;
              pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)
                                  &in_RDI[4].original_workData.
                                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,
                                  (long)in_stack_fffffffffffffee4);
              *pvVar6 = vVar2;
              *(int *)&in_RDI[4].workGroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish =
                   *(int *)&in_RDI[4].workGroup.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_finish + -1;
              if ((local_9c == 0) && ((local_27 & 1) != 0)) {
                printf(": removing pivot gives pack count = %6d",
                       (ulong)*(uint *)&in_RDI[4].workGroup.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish);
              }
              break;
            }
          }
          if ((local_9c == 0) && ((local_27 & 1) != 0)) {
            pcVar8 = "consider unbounded";
            if (0 < *(int *)&in_RDI[4].workGroup.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish) {
              pcVar8 = "repeat CHUZC";
            }
            printf(" so %s\n",pcVar8);
          }
        }
        *(undefined4 *)
         &in_RDI[4].alt_workGroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = 0xffffffff;
      }
      slice = (HighsInt)((ulong)in_stack_fffffffffffffea8 >> 0x20);
      if ((-1 < *(int *)&in_RDI[4].alt_workGroup.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage) ||
         (*(int *)&in_RDI[4].workGroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish < 1)) goto LAB_00789899;
      local_9c = local_9c + 1;
    }
    if ((0 < (int)local_9c) && ((local_27 & 1) != 0)) {
      printf("                                                       Negative step or no candidates after %2d CHUZC passes\n"
             ,(ulong)local_9c);
    }
    if ((local_28 & 1) != 0) {
      this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI->workNumTotPermutation + 0xace);
      paVar9 = &local_c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"dualRow.packValue/Index",paVar9);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed8);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed8);
      HSimplexNla::reportVector
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                 in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f
                );
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
      std::vector<double,_std::allocator<double>_>::~vector(this_00);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    }
    *(undefined4 *)
     &(in_RDI->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = 6;
  }
  return;
}

Assistant:

void HEkkDual::chooseColumn(HVector* row_ep) {
  // Compute pivot row (PRICE) and choose the index of a column to enter the
  // basis (CHUZC)
  //
  // If reinversion is needed then skip this method
  if (rebuild_reason) return;
  HighsOptions* options = ekk_instance_.options_;
  HighsLp& lp = ekk_instance_.lp_;

  HighsInt debug_price_report = kDebugReportOff;
  const bool debug_price_report_on = false;
  const bool debug_small_pivot_issue_report_on = false;
  bool debug_small_pivot_issue_report = false;
  bool debug_rows_report = false;
  if (ekk_instance_.debug_iteration_report_) {
    if (debug_price_report_on) debug_price_report = kDebugReportAll;
    debug_rows_report = debug_price_report_on;
    debug_small_pivot_issue_report = debug_small_pivot_issue_report_on;
    if (debug_price_report != kDebugReportOff || debug_rows_report ||
        debug_small_pivot_issue_report)
      printf("HEkkDual::chooseColumn Check iter = %d\n",
             (int)ekk_instance_.iteration_count_);
  }
  //
  // PRICE
  //
  const bool quad_precision = false;
  ekk_instance_.tableauRowPrice(quad_precision, *row_ep, row_ap,
                                debug_price_report);
  if (debug_rows_report) {
    ekk_instance_.simplex_nla_.reportArray("Row a_p", 0, &row_ap, true);
    ekk_instance_.simplex_nla_.reportArray("Row e_p", lp.num_col_, row_ep,
                                           true);
  }
  //
  // CHUZC
  //
  // Section 0: Clear data and call createFreemove to set a value of
  // nonbasicMove for all free columns to prevent their dual values
  // from being changed.
  analysis->simplexTimerStart(Chuzc0Clock);
  dualRow.clear();
  dualRow.workDelta = delta_primal;
  dualRow.createFreemove(row_ep);
  analysis->simplexTimerStop(Chuzc0Clock);
  //
  // Section 1: Pack row_ap and row_ep
  analysis->simplexTimerStart(Chuzc1Clock);
  // Pack row_ap into the packIndex/Value of HEkkDualRow
  dualRow.chooseMakepack(&row_ap, 0);
  // Pack row_ep into the packIndex/Value of HEkkDualRow
  dualRow.chooseMakepack(row_ep, solver_num_col);
  const double row_ep_scale =
      ekk_instance_.getValueScale(dualRow.packCount, dualRow.packValue);
  analysis->simplexTimerStop(Chuzc1Clock);
  // Loop until an acceptable pivot is found. Each pass either finds a
  // pivot, identifies possible unboundedness, or reduced the number
  // of nonzeros in dualRow.pack_value
  HighsInt chuzc_pass = 0;
  for (;;) {
    //
    // Section 2: Determine the possible variables - candidates for CHUZC
    analysis->simplexTimerStart(Chuzc2Clock);
    dualRow.choosePossible();
    analysis->simplexTimerStop(Chuzc2Clock);
    //
    // Take action if the step to an expanded bound is not positive, or
    // there are no candidates for CHUZC
    variable_in = -1;
    if (dualRow.workTheta <= 0 || dualRow.workCount == 0) {
      if (chuzc_pass > 0 && debug_small_pivot_issue_report) {
        printf(
            "                                                       "
            "Negative step or no candidates after %2d CHUZC passes\n",
            (int)chuzc_pass);
      }
      if (debug_rows_report) {
        ekk_instance_.simplex_nla_.reportVector(
            "dualRow.packValue/Index", dualRow.packCount, dualRow.packValue,
            dualRow.packIndex, true);
      }
      rebuild_reason = kRebuildReasonPossiblyDualUnbounded;
      return;
    }
    //
    // Sections 3 and 4: Perform (bound-flipping) ratio test. This can
    // fail if the dual values are excessively large
    bool chooseColumnFail = (dualRow.chooseFinal() != 0);
    if (chooseColumnFail) {
      rebuild_reason = kRebuildReasonChooseColumnFail;
      return;
    }
    if (dualRow.workPivot >= 0) {
      const double growth_tolerance =
          options->dual_simplex_pivot_growth_tolerance;  // kHighsMacheps; //
      // A pivot has been chosen
      double alpha_row = dualRow.workAlpha;
      assert(alpha_row);
      const double scaled_value = row_ep_scale * alpha_row;
      if (std::abs(scaled_value) <= growth_tolerance) {
        if (chuzc_pass == 0 && debug_small_pivot_issue_report)
          printf(
              "CHUZC: Solve %6d; Iter %4d; ||e_p|| = %11.4g: Variable %6d "
              "Pivot %11.4g (dual "
              "%11.4g; ratio = %11.4g) is small",
              (int)ekk_instance_.debug_solve_call_num_,
              (int)ekk_instance_.iteration_count_, 1.0 / row_ep_scale,
              (int)dualRow.workPivot, dualRow.workAlpha,
              workDual[dualRow.workPivot],
              workDual[dualRow.workPivot] / dualRow.workAlpha);
        // On the first pass, try to make the pivotal row more accurate
        if (chuzc_pass == 0) {
          if (debug_small_pivot_issue_report) printf(": improve row\n");
          ekk_instance_.analysis_.num_improve_choose_column_row_call++;
          improveChooseColumnRow(row_ep);
        } else {
          // Remove the pivot
          ekk_instance_.analysis_.num_remove_pivot_from_pack++;
          for (HighsInt i = 0; i < dualRow.packCount; i++) {
            if (dualRow.packIndex[i] == dualRow.workPivot) {
              dualRow.packIndex[i] = dualRow.packIndex[dualRow.packCount - 1];
              dualRow.packValue[i] = dualRow.packValue[dualRow.packCount - 1];
              dualRow.packCount--;
              if (chuzc_pass == 0 && debug_small_pivot_issue_report)
                printf(": removing pivot gives pack count = %6d",
                       (int)dualRow.packCount);
              break;
            }
          }
          if (chuzc_pass == 0 && debug_small_pivot_issue_report)
            printf(" so %s\n", dualRow.packCount > 0 ? "repeat CHUZC"
                                                     : "consider unbounded");
        }
        // Indicate that no pivot has been chosen
        dualRow.workPivot = -1;
      } else if (chuzc_pass > 0 && debug_small_pivot_issue_report) {
        printf(
            "                                                       Variable "
            "%6d "
            "Pivot %11.4g (dual "
            "%11.4g; ratio = %11.4g) is OK after %2d CHUZC passes\n",
            (int)dualRow.workPivot, dualRow.workAlpha,
            workDual[dualRow.workPivot],
            workDual[dualRow.workPivot] / dualRow.workAlpha, (int)chuzc_pass);
      }
    } else {
      // No pivot has been chosen
      assert(dualRow.workPivot == -1);
      if (chuzc_pass > 0 && debug_small_pivot_issue_report) {
        printf(
            "                                                       No pivot "
            "after %2d CHUZC passes\n",
            (int)chuzc_pass);
      }
      break;
    }
    // If a pivot has been chosen, or there are no more packed values
    // then end CHUZC
    if (dualRow.workPivot >= 0 || dualRow.packCount <= 0) break;
    chuzc_pass++;
  }
  //
  // Section 5: Reset the nonbasicMove values for free columns
  analysis->simplexTimerStart(Chuzc5Clock);
  dualRow.deleteFreemove();
  analysis->simplexTimerStop(Chuzc5Clock);
  // Record values for basis change, checking for numerical problems and update
  // of dual variables
  variable_in = dualRow.workPivot;  // Index of the column entering the basis
  alpha_row = dualRow.workAlpha;    // Pivot value computed row-wise - used for
                                    // numerical checking
  theta_dual = dualRow.workTheta;   // Dual step length

  if (edge_weight_mode == EdgeWeightMode::kDevex && !new_devex_framework) {
    // When using Devex, unless a new framework is to be used, get the
    // exact weight for the pivotal row and, based on its accuracy,
    // determine that a new framework is to be used. In serial
    // new_devex_framework should only ever be false at this point in
    // this method, but in PAMI, this method may be called multiple
    // times in minor iterations and the new framework is set up in
    // majorUpdate.
    analysis->simplexTimerStart(DevexWtClock);
    // Determine the exact Devex weight
    dualRow.computeDevexWeight();
    computed_edge_weight = dualRow.computed_edge_weight;
    computed_edge_weight = max(1.0, computed_edge_weight);
    analysis->simplexTimerStop(DevexWtClock);
  }
  return;
}